

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::BinaryLogLoss::forward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float fVar1;
  Tensor *pTVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  byte bVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  undefined1 auVar14 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int iVar22;
  float fVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  float fVar26;
  undefined1 auVar27 [16];
  Tensor x;
  Tensor y;
  float local_e8;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 uStack_a8;
  float *pfStack_a0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_98;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  float *pfStack_50;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uStack_c8 = *(undefined8 *)(pTVar2->d).d;
  uStack_c0 = *(undefined8 *)((pTVar2->d).d + 2);
  local_b8 = *(undefined8 *)((pTVar2->d).d + 4);
  uStack_b0 = *(ulong *)((pTVar2->d).d + 6);
  uStack_a8 = *(undefined8 *)&(pTVar2->d).bd;
  pfStack_a0 = pTVar2->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_98,&pTVar2->bs);
  pTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start[1];
  uStack_78 = *(undefined8 *)(pTVar2->d).d;
  uStack_70 = *(undefined8 *)((pTVar2->d).d + 2);
  local_68 = *(undefined8 *)((pTVar2->d).d + 4);
  uStack_60 = *(undefined8 *)((pTVar2->d).d + 6);
  uStack_58 = *(undefined8 *)&(pTVar2->d).bd;
  pfStack_50 = pTVar2->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_48,&pTVar2->bs);
  pfVar10 = pfStack_50;
  pfVar9 = pfStack_a0;
  if (uStack_b0 >> 0x20 == 0) {
    iVar22 = 1;
  }
  else {
    auVar15 = vpbroadcastq_avx512f();
    auVar16 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar11 = 0;
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar19 = vmovdqa64_avx512f(auVar16);
      auVar16 = vpbroadcastq_avx512f();
      auVar20 = vporq_avx512f(auVar16,auVar17);
      auVar16 = vporq_avx512f(auVar16,auVar18);
      uVar5 = vpcmpuq_avx512f(auVar16,auVar15,2);
      bVar7 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar20,auVar15,2);
      bVar8 = (byte)uVar5;
      uVar13 = CONCAT11(bVar8,bVar7);
      auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&uStack_c8 + uVar11 * 4));
      auVar16._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar20._4_4_;
      auVar16._0_4_ = (uint)(bVar7 & 1) * auVar20._0_4_;
      auVar16._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar20._8_4_;
      auVar16._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar20._12_4_;
      auVar16._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar20._16_4_;
      auVar16._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar20._20_4_;
      auVar16._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar20._24_4_;
      auVar16._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar20._28_4_;
      auVar16._32_4_ = (uint)(bVar8 & 1) * auVar20._32_4_;
      auVar16._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar20._36_4_;
      auVar16._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar20._40_4_;
      auVar16._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar20._44_4_;
      auVar16._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar20._48_4_;
      auVar16._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar20._52_4_;
      auVar16._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar20._56_4_;
      auVar16._60_4_ = (uint)(bVar8 >> 7) * auVar20._60_4_;
      auVar16 = vpmulld_avx512f(auVar16,auVar19);
      uVar11 = uVar11 + 0x10;
    } while (((uStack_b0 >> 0x20) + 0xf & 0xfffffffffffffff0) != uVar11);
    auVar15 = vmovdqa32_avx512f(auVar16);
    auVar17._0_4_ = (uint)(bVar7 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._0_4_;
    bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar3 * auVar15._4_4_ | (uint)!bVar3 * auVar19._4_4_;
    bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar3 * auVar15._8_4_ | (uint)!bVar3 * auVar19._8_4_;
    bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar3 * auVar15._12_4_ | (uint)!bVar3 * auVar19._12_4_;
    bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar3 * auVar15._16_4_ | (uint)!bVar3 * auVar19._16_4_;
    bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar3 * auVar15._20_4_ | (uint)!bVar3 * auVar19._20_4_;
    bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar3 * auVar15._24_4_ | (uint)!bVar3 * auVar19._24_4_;
    bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar3 * auVar15._28_4_ | (uint)!bVar3 * auVar19._28_4_;
    auVar17._32_4_ = (uint)(bVar8 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar19._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar3 * auVar15._36_4_ | (uint)!bVar3 * auVar19._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar3 * auVar15._40_4_ | (uint)!bVar3 * auVar19._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar3 * auVar15._44_4_ | (uint)!bVar3 * auVar19._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar3 * auVar15._48_4_ | (uint)!bVar3 * auVar19._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar3 * auVar15._52_4_ | (uint)!bVar3 * auVar19._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar3 * auVar15._56_4_ | (uint)!bVar3 * auVar19._56_4_;
    auVar17._60_4_ =
         (uint)(bVar8 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar19._60_4_;
    auVar14 = vextracti64x4_avx512f(auVar17,1);
    in_ZmmResult = vpmulld_avx512f(auVar17,ZEXT3264(auVar14));
    auVar27 = vpmulld_avx(in_ZmmResult._0_16_,in_ZmmResult._16_16_);
    auVar4 = vpshufd_avx(auVar27,0xee);
    auVar27 = vpmulld_avx(auVar27,auVar4);
    auVar4 = vpshufd_avx(auVar27,0x55);
    auVar27 = vpmulld_avx(auVar27,auVar4);
    iVar22 = auVar27._0_4_;
  }
  uVar12 = iVar22 * (int)uStack_a8;
  if (uVar12 == 0) {
    fVar26 = 0.0;
  }
  else {
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    uVar11 = 0;
    fVar26 = 0.0;
    do {
      fVar23 = pfVar9[uVar11];
      fVar1 = pfVar10[uVar11];
      auVar27 = ZEXT416((uint)fVar23);
      auVar18._16_48_ = in_ZmmResult._16_48_;
      if (fVar1 == 1.0) {
        uVar5 = vcmpss_avx512f(auVar27,auVar15._0_16_,0);
        bVar3 = (bool)((byte)uVar5 & 1);
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        auVar18._0_16_ = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar6);
        in_ZmmResult = auVar18;
        fVar23 = logf((float)((uint)bVar3 * 0x800000 + (uint)!bVar3 * (int)fVar23));
        local_e8 = auVar18._0_4_;
        fVar23 = fVar23 * local_e8;
      }
      else if (fVar1 == 0.0) {
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        in_ZmmResult._0_16_ = vxorps_avx512vl(auVar27,auVar4);
        in_ZmmResult._16_48_ = auVar18._16_48_;
        uVar5 = vcmpss_avx512f(auVar27,ZEXT416(0x3f800000),0);
        bVar3 = (bool)((byte)uVar5 & 1);
        auVar24._0_4_ =
             log1pf((float)((uint)bVar3 * -0x7f800000 + (uint)!bVar3 * in_ZmmResult._0_4_));
        auVar24._4_60_ = extraout_var;
        auVar27 = vfmsub132ss_fma(auVar24._0_16_,auVar24._0_16_,ZEXT416((uint)fVar1));
        fVar23 = auVar27._0_4_;
      }
      else {
        uVar5 = vcmpss_avx512f(auVar27,auVar15._0_16_,0);
        bVar3 = (bool)((byte)uVar5 & 1);
        auVar19._16_48_ = auVar18._16_48_;
        auVar19._0_16_ = auVar27;
        auVar15._4_60_ = auVar19._4_60_;
        auVar15._0_4_ = (uint)bVar3 * 0x800000 + (uint)!bVar3 * (int)fVar23;
        auVar21._0_16_ = auVar15._0_16_;
        uVar5 = vcmpss_avx512f(auVar21._0_16_,ZEXT416(0x3f800000),0);
        bVar3 = (bool)((byte)uVar5 & 1);
        auVar21._16_48_ = auVar18._16_48_;
        auVar20._4_60_ = auVar21._4_60_;
        auVar20._0_4_ = (float)((uint)bVar3 * 0x800000 + (uint)!bVar3 * auVar15._0_4_);
        fVar23 = logf(auVar20._0_4_);
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        in_ZmmResult._0_16_ = vxorps_avx512vl(auVar20._0_16_,auVar27);
        in_ZmmResult._16_48_ = auVar18._16_48_;
        auVar25._0_4_ = log1pf(in_ZmmResult._0_4_);
        auVar25._4_60_ = extraout_var_00;
        auVar27 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar25._0_4_ - fVar23)),
                                  auVar25._0_16_);
        fVar23 = auVar27._0_4_;
      }
      fVar26 = fVar23 + fVar26;
      uVar11 = uVar11 + 1;
      auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
    } while (uVar12 != uVar11);
  }
  *fx->v = fVar26;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98);
  return;
}

Assistant:

void BinaryLogLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  auto x = *xs[0];
  auto y = *xs[1];
  FBinaryLogLoss bll;
  const size_t s = x.d.size();
  float dist = 0;
  for (size_t i = 0; i < s; ++i)
    dist += bll(x.v[i], y.v[i]);
  fx.v[0] = dist;
#endif
}